

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse_new.hpp
# Opt level: O2

SparseAccessor * __thiscall
Disa::Matrix_Sparse_Row<double,_int>::SparseAccessor::operator=
          (SparseAccessor *this,const_reference_value value)

{
  csr_data *this_00;
  long lVar1;
  double *in_R9;
  index_type i_row;
  undefined1 local_4c [4];
  Matrix_Sparse_Row<double,_int> local_48;
  
  this_00 = this->row_->ptr_data;
  local_4c = SUB84((ulong)((long)(this->row_->iter_row_offset)._M_current -
                          (long)(this_00->row_offset).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2,0);
  insert_or_assign<double,int,int>
            ((pair<std::tuple<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_bool>
              *)(local_4c + 4),(Disa *)this_00,(CSR_Data<double,_int> *)local_4c,&this->i_column,
             (int *)value,in_R9);
  local_48.ptr_data = this->row_->ptr_data;
  local_48.iter_row_offset._M_current =
       (int *)(*(long *)&((local_48.ptr_data)->row_offset).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data + (long)(int)local_4c * 4);
  lVar1 = (long)*local_48.iter_row_offset._M_current;
  local_48.i_column._M_ptr =
       ((local_48.ptr_data)->i_column).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start + lVar1;
  local_48.i_column._M_extent._M_extent_value = local_48.iter_row_offset._M_current[1] - lVar1;
  local_48.value._M_ptr =
       ((local_48.ptr_data)->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start + lVar1;
  local_48.value._M_extent._M_extent_value = local_48.i_column._M_extent._M_extent_value;
  Matrix_Sparse_Row<double,_int>::operator=
            (this->row_,(Matrix_Sparse_Row<double,_int> *)(local_4c + 4));
  return this;
}

Assistant:

SparseAccessor& operator=(const_reference_value value) {
      const index_type i_row = row_.row();
      insert_or_assign(*row_.ptr_data, i_row, i_column, value);
      row_ = std::move(Matrix_Sparse_Row(row_.ptr_data, row_.ptr_data->row_offset.begin() + i_row));
      return *this;
    }